

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *targetOutput)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  string_view sVar4;
  bool linkScriptShell;
  bool bVar5;
  int iVar6;
  cmLinkLineDeviceComputer *this_00;
  cmLinkLineComputer *pcVar7;
  type linkLineComputer_00;
  undefined4 extraout_var;
  pointer pcVar8;
  char *name_00;
  string *psVar9;
  string *relDir;
  type os;
  iterator __first;
  iterator __last;
  cmOutputConverter *pcVar10;
  cmOutputConverter *local_770;
  cmOutputConverter *local_6d8;
  char *name;
  cmAlphaNum local_640;
  string local_610;
  string *local_5f0;
  string *real_link_command;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  cmAlphaNum local_598;
  string local_568;
  string *local_548;
  allocator<char> local_539;
  string local_538;
  cmValue local_518;
  cmValue val;
  string launcher;
  undefined1 local_4e0 [8];
  string targetOutPathCompilePDB;
  undefined1 local_4a0 [8];
  string targetFullPathCompilePDB;
  undefined1 local_450 [8];
  string target;
  string local_400;
  undefined1 local_3e0 [8];
  string objectDir;
  RuleVariables vars;
  string buildObjs;
  string linkLibs;
  undefined1 local_210 [8];
  string ignored_;
  string linkFlags;
  cmStateDirectory local_1b8;
  unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_> local_190;
  unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
  linkLineComputer;
  bool useResponseFileForLibs;
  bool useResponseFileForObjects;
  undefined1 local_170 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string linkRule;
  undefined1 local_130 [8];
  string linkRuleVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  undefined1 local_f0 [7];
  bool useLinkScript;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  undefined1 local_98 [8];
  string langFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string linkLanguage;
  string *targetOutput_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  bool relink_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  linkLanguage.field_2._8_8_ = targetOutput;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"CUDA",&local_49);
  std::allocator<char>::~allocator(&local_49);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&langFlags.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(pvVar1);
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,pvVar1,(string *)local_48);
  std::__cxx11::string::string((string *)local_98);
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)
             &exeCleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar3,(string *)local_98,pcVar2,(string *)local_48,
             (string *)
             &exeCleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &exeCleanFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)local_f0,
             &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             (string *)linkLanguage.field_2._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0,(value_type *)local_f0);
  std::__cxx11::string::~string((string *)local_f0);
  linkScriptShell =
       cmGlobalGenerator::GetUseLinkScript
                 ((cmGlobalGenerator *)(this->super_cmMakefileTargetGenerator).GlobalGenerator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&linkRuleVar.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",
             (allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
  cmMakefileTargetGenerator::GetLinkRule
            ((string *)
             &commands1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->super_cmMakefileTargetGenerator,(string *)local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_170);
  sVar4 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)
                     &commands1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmExpandList(sVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&linkRuleVar.field_2 + 8),false);
  linkLineComputer._M_t.
  super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
  .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._7_1_ =
       cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                 (&this->super_cmMakefileTargetGenerator,(string *)local_48);
  linkLineComputer._M_t.
  super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
  .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._6_1_ =
       cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                 (&this->super_cmMakefileTargetGenerator,(string *)local_48);
  cmOutputConverter::SetLinkScriptShell
            (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             linkScriptShell);
  this_00 = (cmLinkLineDeviceComputer *)operator_new(0x40);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_6d8 = (cmOutputConverter *)0x0;
  if (pcVar3 != (cmLocalUnixMakefileGenerator3 *)0x0) {
    local_6d8 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
  }
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)((long)&linkFlags.field_2 + 8),
             (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmStateSnapshot::GetDirectory(&local_1b8,(cmStateSnapshot *)((long)&linkFlags.field_2 + 8));
  cmLinkLineDeviceComputer::cmLinkLineDeviceComputer(this_00,local_6d8,&local_1b8);
  std::unique_ptr<cmLinkLineDeviceComputer,std::default_delete<cmLinkLineDeviceComputer>>::
  unique_ptr<std::default_delete<cmLinkLineDeviceComputer>,void>
            ((unique_ptr<cmLinkLineDeviceComputer,std::default_delete<cmLinkLineDeviceComputer>> *)
             &local_190,this_00);
  pcVar7 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            operator->(&local_190)->super_cmLinkLineComputer;
  cmLinkLineComputer::SetForResponse
            (pcVar7,(bool)(linkLineComputer._M_t.
                           super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
                           .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl.
                           _6_1_ & 1));
  pcVar7 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            operator->(&local_190)->super_cmLinkLineComputer;
  cmLinkLineComputer::SetRelink(pcVar7,relink);
  std::__cxx11::string::string((string *)(ignored_.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_210);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  linkLineComputer_00 =
       std::unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
       operator*(&local_190);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)((long)&linkLibs.field_2 + 8),&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar3,linkLineComputer_00,(string *)((long)&linkLibs.field_2 + 8),
             (string *)local_210,(string *)((long)&ignored_.field_2 + 8),(string *)local_210,
             (string *)local_210,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(buildObjs.field_2._M_local_buf + 8));
  pcVar7 = &std::
            unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
            get(&local_190)->super_cmLinkLineComputer;
  cmMakefileTargetGenerator::CreateLinkLibs
            (&this->super_cmMakefileTargetGenerator,pcVar7,
             (string *)(buildObjs.field_2._M_local_buf + 8),
             (bool)(linkLineComputer._M_t.
                    super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
                    .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._6_1_ & 1
                   ),(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&langFlags.field_2 + 8),DeviceLink);
  std::__cxx11::string::string((string *)&vars.Launcher);
  cmMakefileTargetGenerator::CreateObjectLists
            (&this->super_cmMakefileTargetGenerator,linkScriptShell,false,
             (bool)(linkLineComputer._M_t.
                    super___uniq_ptr_impl<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmLinkLineDeviceComputer_*,_std::default_delete<cmLinkLineDeviceComputer>_>
                    .super__Head_base<0UL,_cmLinkLineDeviceComputer_*,_false>._M_head_impl._7_1_ & 1
                   ),(string *)&vars.Launcher,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&langFlags.field_2 + 8),false,DeviceLink);
  cmRulePlaceholderExpander::RuleVariables::RuleVariables
            ((RuleVariables *)((long)&objectDir.field_2 + 8));
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_3e0,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  pcVar10 = &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
             ).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)((long)&target.field_2 + 8),pcVar10,(string *)local_3e0);
  sVar4 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(target.field_2._M_local_buf + 8));
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_400,pcVar10,sVar4,SHELL);
  std::__cxx11::string::operator=((string *)local_3e0,(string *)&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)(target.field_2._M_local_buf + 8));
  pcVar10 = &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
             ).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)((long)&targetFullPathCompilePDB.field_2 + 8),pcVar10,
             (string *)linkLanguage.field_2._8_8_);
  sVar4 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_((string *)local_450,pcVar10,sVar4,SHELL);
  std::__cxx11::string::~string((string *)(targetFullPathCompilePDB.field_2._M_local_buf + 8));
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)((long)&targetOutPathCompilePDB.field_2 + 8),
             &this->super_cmMakefileTargetGenerator);
  cmCommonTargetGenerator::ComputeTargetCompilePDB
            ((string *)local_4a0,(cmCommonTargetGenerator *)this,
             (string *)((long)&targetOutPathCompilePDB.field_2 + 8));
  std::__cxx11::string::~string((string *)(targetOutPathCompilePDB.field_2._M_local_buf + 8));
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  sVar4 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_4a0)
  ;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)local_4e0,
             &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             sVar4,SHELL);
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.AIXExports = (char *)std::__cxx11::string::c_str();
  vars.Object = (char *)std::__cxx11::string::c_str();
  vars.Objects = (char *)std::__cxx11::string::c_str();
  vars.Target = (char *)std::__cxx11::string::c_str();
  vars.Manifests = (char *)std::__cxx11::string::c_str();
  vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
  vars.TargetPDB = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)&val);
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"RULE_LAUNCH_LINK",&local_539);
  local_518 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar3,pcVar2,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  local_548 = local_518.Value;
  bVar5 = cmNonempty(local_518);
  if (bVar5) {
    psVar9 = cmValue::operator*[abi_cxx11_(&local_518);
    cmAlphaNum::cmAlphaNum(&local_598,psVar9);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&rulePlaceholderExpander,' ');
    cmStrCat<>(&local_568,&local_598,(cmAlphaNum *)&rulePlaceholderExpander);
    std::__cxx11::string::operator=((string *)&val,(string *)&local_568);
    std::__cxx11::string::~string((string *)&local_568);
  }
  iVar6 = (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator)
            .super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )&__range1,(pointer)CONCAT44(extraout_var,iVar6));
  pcVar8 = std::
           unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
           operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       *)&__range1);
  cmRulePlaceholderExpander::SetTargetImpLib(pcVar8,(string *)linkLanguage.field_2._8_8_);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&linkRuleVar.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar1);
  real_link_command =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(pvVar1);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&real_link_command), bVar5) {
    local_5f0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    cmAlphaNum::cmAlphaNum(&local_640,(string *)&val);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&name,local_5f0);
    cmStrCat<>(&local_610,&local_640,(cmAlphaNum *)&name);
    std::__cxx11::string::operator=((string *)local_5f0,(string *)&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    pcVar8 = std::
             unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
             ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                           *)&__range1);
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    local_770 = (cmOutputConverter *)0x0;
    if (pcVar3 != (cmLocalUnixMakefileGenerator3 *)0x0) {
      local_770 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar8,local_770,local_5f0,(RuleVariables *)((long)&objectDir.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmOutputConverter::SetLinkScriptShell
            (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)&__range1);
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)local_4e0);
  std::__cxx11::string::~string((string *)local_4a0);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_3e0);
  std::__cxx11::string::~string((string *)&vars.Launcher);
  std::__cxx11::string::~string((string *)(buildObjs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)(ignored_.field_2._M_local_buf + 8));
  std::unique_ptr<cmLinkLineDeviceComputer,_std::default_delete<cmLinkLineDeviceComputer>_>::
  ~unique_ptr(&local_190);
  if (linkScriptShell) {
    name_00 = "dlink.txt";
    if (relink) {
      name_00 = "drelink.txt";
    }
    cmMakefileTargetGenerator::CreateLinkScript
              (&this->super_cmMakefileTargetGenerator,name_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkRuleVar.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_170,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&langFlags.field_2 + 8));
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_170,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&linkRuleVar.field_2 + 8));
  }
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile
                     );
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand
            (pcVar3,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_170,psVar9,relDir);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (commands,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_170);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  os = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
       operator*(&(this->super_cmMakefileTargetGenerator).BuildFileStream);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (pcVar3,(ostream *)os,(char *)0x0,(string *)linkLanguage.field_2._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&langFlags.field_2 + 8),commands,false,false);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d0);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_cmMakefileTargetGenerator).CleanFiles,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  std::__cxx11::string::~string
            ((string *)
             &commands1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&linkRuleVar.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::__cxx11::string::~string((string *)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&langFlags.field_2 + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule(
  bool relink, std::vector<std::string>& commands,
  const std::string& targetOutput)
{
  const std::string linkLanguage = "CUDA";

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Add language feature flags.
  std::string langFlags;
  this->LocalGenerator->AddLanguageFlagsForLinking(
    langFlags, this->GeneratorTarget, linkLanguage, this->GetConfigName());

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(
    this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmExpandList(linkRule, real_link_commands);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineDeviceComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetRelink(relink);

    // Create set of linking flags.
    std::string linkFlags;
    std::string ignored_;
    this->LocalGenerator->GetDeviceLinkFlags(
      *linkLineComputer, this->GetConfigName(), ignored_, linkFlags, ignored_,
      ignored_, this->GeneratorTarget);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(
      linkLineComputer.get(), linkLibs, useResponseFileForLibs, depends,
      cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(
      useLinkScript, false, useResponseFileForObjects, buildObjs, depends,
      false, cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput),
      cmOutputConverter::SHELL);

    std::string targetFullPathCompilePDB =
      this->ComputeTargetCompilePDB(this->GetConfigName());
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.LanguageCompileFlags = langFlags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    cmValue val = this->LocalGenerator->GetRuleLauncher(this->GeneratorTarget,
                                                        "RULE_LAUNCH_LINK");
    if (cmNonempty(val)) {
      launcher = cmStrCat(*val, ' ');
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutput);
    for (std::string& real_link_command : real_link_commands) {
      real_link_command = cmStrCat(launcher, real_link_command);
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cm::append(commands, commands1);
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutput, depends, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(exeCleanFiles.begin(), exeCleanFiles.end());
}